

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

void __thiscall Iex_3_4::BaseExc::BaseExc(BaseExc *this,BaseExc *be)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__EnotenqueuedExc_00174618;
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  pcVar1 = (be->_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_message,pcVar1,pcVar1 + (be->_message)._M_string_length);
  (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
  pcVar1 = (be->_stackTrace)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_stackTrace,pcVar1,pcVar1 + (be->_stackTrace)._M_string_length);
  return;
}

Assistant:

BaseExc::BaseExc (const BaseExc& be)
    : _message (be._message), _stackTrace (be._stackTrace)
{}